

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void rffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  ulong M_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  byte bVar9;
  byte bVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ushort uVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  ulong uVar17;
  
  M_00 = M - 1;
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      lVar15 = Rows + 1;
      do {
        fVar2 = *ioptr;
        *ioptr = ioptr[1] + fVar2;
        ioptr[1] = fVar2 - ioptr[1];
        ioptr = ioptr + (2L << (M_00 & 0x3f));
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
      Rows = 0;
    }
  case 2:
    if (0 < Rows) {
      pfVar11 = ioptr + 3;
      lVar15 = Rows + 1;
      do {
        fVar2 = pfVar11[-3];
        fVar3 = pfVar11[-2];
        fVar4 = pfVar11[-1] + fVar2;
        fVar5 = *pfVar11 + fVar3;
        pfVar11[-3] = fVar5 + fVar4;
        pfVar11[-2] = fVar4 - fVar5;
        pfVar11[-1] = fVar2 - pfVar11[-1];
        *pfVar11 = *pfVar11 - fVar3;
        pfVar11 = pfVar11 + (2L << (M_00 & 0x3f));
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
    break;
  case 3:
    if (0 < Rows) {
      pfVar11 = ioptr + 7;
      lVar15 = Rows + 1;
      do {
        fVar2 = pfVar11[-1] + pfVar11[-5];
        fVar3 = *pfVar11 + pfVar11[-4];
        uVar14 = *(ulong *)(pfVar11 + -7);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar14;
        uVar12 = *(ulong *)(pfVar11 + -3);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar12;
        auVar24._0_4_ = (float)uVar12 + (float)uVar14;
        auVar24._4_4_ = (float)(uVar12 >> 0x20) + (float)(uVar14 >> 0x20);
        auVar24._8_8_ = 0;
        auVar19 = vmovshdup_avx(auVar24);
        auVar21 = vsubps_avx(auVar21,auVar23);
        fVar4 = auVar24._0_4_ + fVar2;
        fVar5 = auVar19._0_4_ + fVar3;
        auVar25._0_4_ = auVar21._0_4_ * 2.0;
        auVar25._4_4_ = auVar21._4_4_ * 1.4142135;
        auVar25._8_4_ = auVar21._8_4_ * 0.0;
        auVar25._12_4_ = auVar21._12_4_ * 0.0;
        auVar20 = vmovshdup_avx(auVar25);
        auVar18 = vhaddps_avx(auVar25,auVar25);
        fVar6 = (pfVar11[-4] - *pfVar11) * -1.4142135;
        auVar22 = ZEXT416((uint)(pfVar11[-5] - pfVar11[-1]));
        auVar20 = vfnmsub231ss_fma(auVar20,auVar22,SUB6416(ZEXT464(0x40000000),0));
        auVar23 = ZEXT416((uint)(auVar18._0_4_ + fVar6));
        auVar21 = vfmsub213ss_fma(auVar21,SUB6416(ZEXT464(0x40800000),0),auVar23);
        auVar18 = ZEXT416((uint)(fVar6 + auVar20._0_4_));
        auVar20 = vfmadd213ss_fma(auVar22,SUB6416(ZEXT464(0x40800000),0),auVar18);
        pfVar11[-3] = auVar24._0_4_ - fVar2;
        pfVar11[-2] = fVar3 - auVar19._0_4_;
        pfVar11[-7] = fVar5 + fVar4;
        pfVar11[-6] = fVar4 - fVar5;
        auVar18 = vinsertps_avx(auVar23,auVar18,0x10);
        auVar22._0_4_ = auVar18._0_4_ * 0.5;
        auVar22._4_4_ = auVar18._4_4_ * 0.5;
        auVar22._8_4_ = auVar18._8_4_ * 0.5;
        auVar22._12_4_ = auVar18._12_4_ * 0.5;
        uVar7 = vmovlps_avx(auVar22);
        *(undefined8 *)(pfVar11 + -5) = uVar7;
        pfVar11[-1] = auVar21._0_4_ * 0.5;
        *pfVar11 = auVar20._0_4_ * 0.5;
        pfVar11 = pfVar11 + (2L << (M_00 & 0x3f));
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
    break;
  case 4:
    if (0 < Rows) {
      pfVar11 = ioptr + 0xf;
      lVar15 = Rows + 1;
      do {
        auVar18 = vaddss_avx512f(ZEXT416((uint)pfVar11[-5]),ZEXT416((uint)pfVar11[-0xd]));
        auVar19 = vaddss_avx512f(ZEXT416((uint)pfVar11[-4]),ZEXT416((uint)pfVar11[-0xc]));
        auVar20 = vsubss_avx512f(ZEXT416((uint)pfVar11[-9]),ZEXT416((uint)pfVar11[-1]));
        auVar21 = vsubss_avx512f(ZEXT416((uint)pfVar11[-8]),ZEXT416((uint)*pfVar11));
        auVar22 = vaddss_avx512f(ZEXT416((uint)pfVar11[-1]),ZEXT416((uint)pfVar11[-9]));
        auVar23 = vaddss_avx512f(ZEXT416((uint)*pfVar11),ZEXT416((uint)pfVar11[-8]));
        auVar24 = vaddss_avx512f(auVar22,auVar18);
        auVar25 = vaddss_avx512f(auVar23,auVar19);
        auVar22 = vsubss_avx512f(auVar18,auVar22);
        auVar19 = vsubss_avx512f(auVar19,auVar23);
        auVar26 = ZEXT416((uint)(pfVar11[-0xd] - pfVar11[-5]));
        auVar18 = vsubss_avx512f(auVar26,auVar21);
        auVar27 = ZEXT416((uint)(pfVar11[-0xc] - pfVar11[-4]));
        auVar23 = vaddss_avx512f(auVar20,auVar27);
        auVar21 = vaddss_avx512f(auVar21,auVar26);
        auVar20 = vsubss_avx512f(auVar27,auVar20);
        auVar27 = SUB6416(ZEXT464(0x3f3504f3),0);
        auVar21 = vmulss_avx512f(auVar21,auVar27);
        auVar20 = vmulss_avx512f(auVar20,ZEXT416(0xbf3504f3));
        auVar26 = vmulss_avx512f(auVar18,auVar27);
        auVar23 = vmulss_avx512f(auVar23,auVar27);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(pfVar11 + -0xf);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(pfVar11 + -7);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(pfVar11 + -0xb);
        auVar27 = vaddps_avx512vl(auVar29,auVar28);
        auVar18 = vsubps_avx(auVar28,auVar29);
        auVar28 = vmovshdup_avx512vl(auVar18);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(pfVar11 + -3);
        auVar29 = vsubps_avx512vl(auVar31,auVar32);
        auVar30 = vmovshdup_avx512vl(auVar29);
        auVar31 = vaddps_avx512vl(auVar32,auVar31);
        auVar32 = vaddps_avx512vl(auVar31,auVar27);
        auVar33 = vmovshdup_avx512vl(auVar32);
        auVar27 = vsubps_avx512vl(auVar27,auVar31);
        auVar31 = vsubss_avx512f(auVar18,auVar30);
        auVar34 = vaddss_avx512f(auVar29,auVar28);
        auVar18 = vaddss_avx512f(auVar30,auVar18);
        auVar28 = vsubss_avx512f(auVar28,auVar29);
        auVar29 = vsubss_avx512f(auVar25,auVar33);
        auVar25 = vaddss_avx512f(auVar25,auVar33);
        auVar30 = vaddss_avx512f(auVar20,auVar18);
        auVar30 = vsubss_avx512f(auVar30,auVar21);
        auVar21 = vaddss_avx512f(auVar28,auVar21);
        auVar20 = vaddss_avx512f(auVar20,auVar21);
        auVar35 = SUB6416(ZEXT464(0x40000000),0);
        auVar21 = vfmsub213ss_avx512f(auVar18,auVar35,auVar30);
        auVar28 = vfmsub213ss_avx512f(auVar28,auVar35,auVar20);
        auVar18 = vsubss_avx512f(auVar31,auVar23);
        auVar33 = vaddss_avx512f(auVar18,auVar26);
        auVar18 = vaddss_avx512f(auVar23,auVar34);
        auVar23 = vaddss_avx512f(auVar18,auVar26);
        auVar26 = vfmsub213ss_avx512f(auVar31,auVar35,auVar33);
        auVar31 = vfmsub213ss_avx512f(auVar34,auVar35,auVar23);
        auVar18._0_4_ = auVar27._0_4_ * 2.0;
        auVar18._4_4_ = auVar27._4_4_ * 1.4142135;
        auVar18._8_4_ = auVar27._8_4_ * 0.0;
        auVar18._12_4_ = auVar27._12_4_ * 0.0;
        auVar34 = vmovshdup_avx512vl(auVar18);
        auVar18 = vhaddps_avx(auVar18,auVar18);
        auVar19 = vmulss_avx512f(auVar19,SUB6416(ZEXT464(0xbfb504f3),0));
        auVar34 = vfnmsub231ss_avx512f(auVar34,auVar22,auVar35);
        auVar35 = vaddss_avx512f(auVar21,auVar33);
        auVar36 = vsubss_avx512f(auVar28,auVar23);
        auVar23 = vaddss_avx512f(auVar28,auVar23);
        auVar21 = vsubss_avx512f(auVar33,auVar21);
        auVar60 = SUB6416(ZEXT464(0x3f6c835e),0);
        auVar28 = vfmadd213ss_avx512f(auVar60,auVar23,auVar35);
        auVar61 = SUB6416(ZEXT464(0x3ec3ef15),0);
        auVar23 = vfmsub213ss_avx512f(auVar23,auVar61,auVar36);
        auVar33 = vaddss_avx512f(auVar35,auVar35);
        auVar35 = vaddss_avx512f(auVar36,auVar36);
        auVar36 = vaddss_avx512f(auVar26,auVar30);
        auVar37 = vsubss_avx512f(auVar31,auVar20);
        auVar20 = vaddss_avx512f(auVar31,auVar20);
        auVar26 = vsubss_avx512f(auVar30,auVar26);
        auVar30 = vfmadd213ss_avx512f(auVar60,auVar26,auVar36);
        auVar31 = vfmsub213ss_avx512f(auVar60,auVar20,auVar37);
        auVar36 = vaddss_avx512f(auVar36,auVar36);
        auVar37 = vaddss_avx512f(auVar37,auVar37);
        pfVar11[-6] = auVar29._0_4_;
        auVar29 = vaddss_avx512f(auVar24,auVar32);
        auVar38 = vaddss_avx512f(auVar25,auVar29);
        auVar39 = vaddss_avx512f(auVar18,auVar19);
        auVar19 = vaddss_avx512f(auVar19,auVar34);
        auVar18 = vfmsub213ss_fma(auVar27,SUB6416(ZEXT464(0x40800000),0),auVar39);
        auVar22 = vfmadd213ss_avx512f(auVar22,SUB6416(ZEXT464(0x40800000),0),auVar19);
        auVar27 = vfmadd231ss_avx512f(auVar28,auVar21,auVar61);
        auVar21 = vfmsub231ss_avx512f(auVar23,auVar60,auVar21);
        auVar20 = vfmadd231ss_avx512f(auVar30,auVar61,auVar20);
        auVar23 = vfmsub231ss_avx512f(auVar31,auVar61,auVar26);
        pfVar11[-0xf] = auVar38._0_4_;
        pfVar11[-3] = auVar18._0_4_ * 0.5;
        pfVar11[-2] = auVar22._0_4_ * 0.5;
        auVar18 = vinsertps_avx512f(auVar19,auVar20,0x10);
        auVar19 = vinsertps_avx512f(auVar18,auVar23,0x20);
        auVar18 = vshufps_avx512vl(auVar27,auVar21,0);
        auVar18 = vinsertps_avx(auVar18,auVar39,0x30);
        auVar22 = vunpcklps_avx512vl(auVar29,auVar32);
        auVar63._0_8_ = auVar22._0_8_;
        auVar63._8_8_ = auVar63._0_8_;
        auVar63._16_8_ = auVar63._0_8_;
        auVar63._24_8_ = auVar63._0_8_;
        auVar62._0_4_ = auVar24._0_4_;
        auVar62._4_4_ = auVar62._0_4_;
        auVar62._8_4_ = auVar62._0_4_;
        auVar62._12_4_ = auVar62._0_4_;
        auVar62._16_4_ = auVar62._0_4_;
        auVar62._20_4_ = auVar62._0_4_;
        auVar62._24_4_ = auVar62._0_4_;
        auVar62._28_4_ = auVar62._0_4_;
        auVar62 = vblendps_avx(ZEXT1632(auVar25),auVar62,0x80);
        auVar62 = vsubps_avx(auVar63,auVar62);
        auVar8._4_4_ = auVar18._4_4_ * 0.5;
        auVar8._0_4_ = auVar18._0_4_ * 0.5;
        auVar8._8_4_ = auVar18._8_4_ * 0.5;
        auVar8._12_4_ = auVar18._12_4_ * 0.5;
        auVar8._16_4_ = auVar19._0_4_ * 0.5;
        auVar8._20_4_ = auVar19._4_4_ * 0.5;
        auVar8._24_4_ = auVar19._8_4_ * 0.5;
        auVar8._28_4_ = auVar19._12_4_;
        auVar62 = vblendps_avx(auVar8,auVar62,0x81);
        *(undefined1 (*) [32])(pfVar11 + -0xe) = auVar62;
        auVar18 = vinsertps_avx512f(auVar36,auVar23,0x10);
        auVar19 = vinsertps_avx512f(auVar20,auVar37,0x10);
        auVar18 = vsubps_avx(auVar18,auVar19);
        auVar19._0_4_ = auVar18._0_4_ * 0.5;
        auVar19._4_4_ = auVar18._4_4_ * 0.5;
        auVar19._8_4_ = auVar18._8_4_ * 0.5;
        auVar19._12_4_ = auVar18._12_4_ * 0.5;
        uVar7 = vmovlps_avx(auVar19);
        *(undefined8 *)(pfVar11 + -5) = uVar7;
        auVar18 = vinsertps_avx512f(auVar33,auVar21,0x10);
        auVar19 = vinsertps_avx512f(auVar27,auVar35,0x10);
        auVar18 = vsubps_avx(auVar18,auVar19);
        auVar20._0_4_ = auVar18._0_4_ * 0.5;
        auVar20._4_4_ = auVar18._4_4_ * 0.5;
        auVar20._8_4_ = auVar18._8_4_ * 0.5;
        auVar20._12_4_ = auVar18._12_4_ * 0.5;
        uVar7 = vmovlps_avx(auVar20);
        *(undefined8 *)(pfVar11 + -1) = uVar7;
        pfVar11 = pfVar11 + (2L << (M_00 & 0x3f));
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
    break;
  default:
    if (0 < Rows) {
      lVar15 = (M + -2) / 3;
      lVar13 = (M + -2) % 3;
      uVar14 = ((ulong)(1L << (M_00 & 0x3f)) >> 3) + 0xf & 0xfffffffffffffff0;
      auVar40 = vpbroadcastq_avx512f();
      auVar40 = vmovdqu64_avx512f(auVar40);
      do {
        scbitrevR2(ioptr,M_00,BRLow,0.5);
        uVar12 = (ulong)(lVar13 == 1) * 2 + 2;
        if (2 < M_00 && lVar13 == 1) {
          uVar12 = 0;
          auVar41 = vmovdqu64_avx512f(auVar40);
          auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pfVar11 = ioptr;
          do {
            auVar44 = vpbroadcastq_avx512f();
            auVar45 = vporq_avx512f(auVar44,auVar42);
            auVar44 = vporq_avx512f(auVar44,auVar43);
            uVar7 = vpcmpuq_avx512f(auVar44,auVar41,2);
            bVar9 = (byte)uVar7;
            uVar7 = vpcmpuq_avx512f(auVar45,auVar41,2);
            bVar10 = (byte)uVar7;
            uVar16 = CONCAT11(bVar10,bVar9);
            uVar17 = (ulong)uVar16;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14));
            auVar45._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar45._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar45._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar45._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar45._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar45._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar45._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar45._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar45._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar45._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar45._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar45._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar45._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar45._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar45._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar45._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 0x10));
            auVar48._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar48._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar48._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar48._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar48._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar48._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar48._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar48._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar48._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar48._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar48._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar48._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar48._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar48._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar48._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar48._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 4));
            auVar49._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar49._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar49._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar49._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar49._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar49._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar49._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar49._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar49._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar49._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar49._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar49._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar49._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar49._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar49._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar49._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 0x14));
            auVar50._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar50._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar50._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar50._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar50._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar50._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar50._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar50._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar50._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar50._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar50._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar50._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar50._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar50._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar50._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar50._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 0x20));
            auVar51._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar51._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar51._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar51._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar51._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar51._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar51._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar51._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar51._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar51._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar51._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar51._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar51._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar51._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar51._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar51._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 0x30));
            auVar52._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar52._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar52._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar52._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar52._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar52._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar52._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar52._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar52._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar52._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar52._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar52._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar52._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar52._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar52._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar52._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 0x24));
            auVar59._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar59._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar59._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar59._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar59._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar59._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar59._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar59._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar59._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar59._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar59._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar59._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar59._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar59._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar59._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar59._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + uVar14 + 0x34));
            auVar46._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar46._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar46._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar46._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar46._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar46._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar46._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar46._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar46._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar46._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar46._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar46._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar46._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar46._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar46._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar46._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vaddps_avx512f(auVar48,auVar45);
            auVar47 = vaddps_avx512f(auVar50,auVar49);
            auVar45 = vsubps_avx512f(auVar45,auVar48);
            auVar48 = vsubps_avx512f(auVar49,auVar50);
            auVar49 = vaddps_avx512f(auVar52,auVar51);
            auVar50 = vaddps_avx512f(auVar46,auVar59);
            auVar51 = vsubps_avx512f(auVar51,auVar52);
            auVar52 = vsubps_avx512f(auVar59,auVar46);
            vscatterdps_avx512f(ZEXT864(pfVar11) + _DAT_00107740,uVar17,auVar44);
            vscatterdps_avx512f(ZEXT864(pfVar11) + _DAT_00107780,uVar17,auVar47);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + _DAT_00107740,uVar17,auVar45);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + _DAT_00107780,uVar17,auVar48);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + _DAT_00107740,uVar17,auVar49);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + _DAT_00107780,uVar17,auVar50);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + _DAT_00107740,uVar17,auVar51);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + _DAT_00107780,uVar17,auVar52);
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + M_00));
            auVar47._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar47._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar47._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar47._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar47._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar47._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar47._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar47._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar47._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar47._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar47._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar47._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar47._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar47._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar47._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar47._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2 + 0x10));
            auVar53._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar53._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar53._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar53._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar53._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar53._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar53._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar53._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar53._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar53._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar53._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar53._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar53._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar53._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar53._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar53._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2));
            auVar54._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar54._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar54._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar54._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar54._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar54._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar54._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar54._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar54._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar54._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar54._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar54._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar54._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar54._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar54._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar54._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar44 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + M + 0xf));
            auVar55._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar44._4_4_;
            auVar55._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_;
            auVar55._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar44._8_4_;
            auVar55._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar44._12_4_;
            auVar55._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar44._16_4_;
            auVar55._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar44._20_4_;
            auVar55._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar44._24_4_;
            auVar55._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar44._28_4_;
            auVar55._32_4_ = (uint)(bVar10 & 1) * auVar44._32_4_;
            auVar55._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar44._36_4_;
            auVar55._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar44._40_4_;
            auVar55._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar44._44_4_;
            auVar55._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar44._48_4_;
            auVar55._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar44._52_4_;
            auVar55._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar44._56_4_;
            auVar55._60_4_ = (uint)(bVar10 >> 7) * auVar44._60_4_;
            auVar45 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + M + 0x1f));
            auVar44._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar45._4_4_;
            auVar44._0_4_ = (uint)(bVar9 & 1) * auVar45._0_4_;
            auVar44._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar45._8_4_;
            auVar44._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar45._12_4_;
            auVar44._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar45._16_4_;
            auVar44._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar45._20_4_;
            auVar44._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar45._24_4_;
            auVar44._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar45._28_4_;
            auVar44._32_4_ = (uint)(bVar10 & 1) * auVar45._32_4_;
            auVar44._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar45._36_4_;
            auVar44._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar45._40_4_;
            auVar44._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar45._44_4_;
            auVar44._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar45._48_4_;
            auVar44._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar45._52_4_;
            auVar44._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar45._56_4_;
            auVar44._60_4_ = (uint)(bVar10 >> 7) * auVar45._60_4_;
            auVar45 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2 + 0x30));
            auVar56._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar45._4_4_;
            auVar56._0_4_ = (uint)(bVar9 & 1) * auVar45._0_4_;
            auVar56._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar45._8_4_;
            auVar56._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar45._12_4_;
            auVar56._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar45._16_4_;
            auVar56._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar45._20_4_;
            auVar56._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar45._24_4_;
            auVar56._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar45._28_4_;
            auVar56._32_4_ = (uint)(bVar10 & 1) * auVar45._32_4_;
            auVar56._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar45._36_4_;
            auVar56._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar45._40_4_;
            auVar56._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar45._44_4_;
            auVar56._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar45._48_4_;
            auVar56._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar45._52_4_;
            auVar56._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar45._56_4_;
            auVar56._60_4_ = (uint)(bVar10 >> 7) * auVar45._60_4_;
            auVar45 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 * 2 + 0x20));
            auVar57._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar45._4_4_;
            auVar57._0_4_ = (uint)(bVar9 & 1) * auVar45._0_4_;
            auVar57._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar45._8_4_;
            auVar57._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar45._12_4_;
            auVar57._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar45._16_4_;
            auVar57._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar45._20_4_;
            auVar57._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar45._24_4_;
            auVar57._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar45._28_4_;
            auVar57._32_4_ = (uint)(bVar10 & 1) * auVar45._32_4_;
            auVar57._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar45._36_4_;
            auVar57._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar45._40_4_;
            auVar57._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar45._44_4_;
            auVar57._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar45._48_4_;
            auVar57._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar45._52_4_;
            auVar57._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar45._56_4_;
            auVar57._60_4_ = (uint)(bVar10 >> 7) * auVar45._60_4_;
            auVar45 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar11 + M + 0x2f));
            auVar58._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar45._4_4_;
            auVar58._0_4_ = (uint)(bVar9 & 1) * auVar45._0_4_;
            auVar58._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar45._8_4_;
            auVar58._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar45._12_4_;
            auVar58._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar45._16_4_;
            auVar58._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar45._20_4_;
            auVar58._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar45._24_4_;
            auVar58._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar45._28_4_;
            auVar58._32_4_ = (uint)(bVar10 & 1) * auVar45._32_4_;
            auVar58._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar45._36_4_;
            auVar58._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar45._40_4_;
            auVar58._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar45._44_4_;
            auVar58._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar45._48_4_;
            auVar58._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar45._52_4_;
            auVar58._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar45._56_4_;
            auVar58._60_4_ = (uint)(bVar10 >> 7) * auVar45._60_4_;
            auVar45 = vaddps_avx512f(auVar53,auVar47);
            auVar48 = vsubps_avx512f(auVar54,auVar55);
            auVar49 = vsubps_avx512f(auVar47,auVar53);
            auVar50 = vaddps_avx512f(auVar55,auVar54);
            auVar51 = vaddps_avx512f(auVar56,auVar44);
            auVar52 = vsubps_avx512f(auVar57,auVar58);
            auVar44 = vsubps_avx512f(auVar44,auVar56);
            auVar59 = vaddps_avx512f(auVar58,auVar57);
            vscatterdps_avx512f(ZEXT864(pfVar11) + _DAT_001077c0,uVar17,auVar45);
            vscatterdps_avx512f(ZEXT864(pfVar11) + auVar49,uVar17,auVar48);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + _DAT_001077c0,uVar17,auVar49);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x10) + auVar49,uVar17,auVar50);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + _DAT_001077c0,uVar17,auVar51);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x20) + auVar49,uVar17,auVar52);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + _DAT_001077c0,uVar17,auVar44);
            vscatterdps_avx512f(ZEXT864(pfVar11) + ZEXT864(0x30) + auVar49,uVar17,auVar59);
            uVar12 = uVar12 + 0x10;
            pfVar11 = pfVar11 + 0x100;
          } while (uVar14 != uVar12);
          uVar12 = 4;
        }
        if (lVar13 == 2) {
          bfR4(ioptr,M_00,uVar12);
          uVar12 = (ulong)(uint)((int)uVar12 << 2);
        }
        if (M_00 < 0xc) {
          bfstages(ioptr,M_00,Utbl,2,uVar12,lVar15);
        }
        else {
          fftrecurs(ioptr,M_00,Utbl,2,uVar12,lVar15);
        }
        frstage(ioptr,M,Utbl);
        ioptr = ioptr + (2L << (M_00 & 0x3f));
        bVar1 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void rffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real fft on the rows of the input array	*/
/* The result is the complex spectra of the positive frequencies */
/* except the location for the first complex number contains the real */
/* values for DC and Nyquest */
/* INPUTS */
/* *ioptr = real input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	in the following order */
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */

float	scale;
long 	StageCnt;
long 	NDiffU;

M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rfft1pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rfft2pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rfft4pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rfft8pt(ioptr);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	scale = 0.5;
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			bfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		else{
			fftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		ioptr += 2*POW2(M);
	}
}
}